

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O0

void __thiscall glauber::Collider::Collider(Collider *this,VarMap *var_map)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  double *pdVar4;
  Nucleus *B;
  type var_map_00;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *this_00;
  long *__sd;
  Nucleus *in_RSI;
  long in_RDI;
  _func_int **pp_Var5;
  double dVar6;
  VarMap *in_stack_00000058;
  Output *in_stack_00000060;
  VarMap *in_stack_00000078;
  Event *in_stack_00000080;
  long seed;
  string *in_stack_fffffffffffffe58;
  variables_map *in_stack_fffffffffffffe60;
  long lVar7;
  Nucleus *in_stack_fffffffffffffe70;
  Nucleus *in_stack_fffffffffffffe78;
  NucleonProfile *profile;
  size_t in_stack_ffffffffffffff20;
  VarMap *in_stack_ffffffffffffff28;
  allocator local_99;
  string local_98 [32];
  long local_78;
  allocator local_69;
  VarMap *in_stack_ffffffffffffff98;
  NucleonProfile *in_stack_ffffffffffffffa0;
  allocator local_41;
  string local_40 [48];
  Nucleus *local_10;
  
  local_10 = in_RSI;
  anon_unknown_6::create_nucleus(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  anon_unknown_6::create_nucleus(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  NucleonProfile::NucleonProfile(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  piVar2 = (int *)(in_RDI + 0xb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"number-events",&local_41);
  boost::program_options::variables_map::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  piVar3 = boost::program_options::variable_value::as<int>((variable_value *)0x16ccc3);
  iVar1 = *piVar3;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *piVar2 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98,"b-min",&local_69);
  boost::program_options::variables_map::operator[]
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  pdVar4 = boost::program_options::variable_value::as<double>((variable_value *)0x16cd8e);
  profile = (NucleonProfile *)*pdVar4;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  *(NucleonProfile **)(in_RDI + 0xc0) = profile;
  B = (Nucleus *)(in_RDI + 200);
  var_map_00 = std::unique_ptr<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>::operator*
                         ((unique_ptr<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_> *)
                          in_stack_fffffffffffffe60);
  std::unique_ptr<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>::operator*
            ((unique_ptr<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_> *)
             in_stack_fffffffffffffe60);
  pp_Var5 = (_func_int **)anon_unknown_6::determine_bmax((VarMap *)var_map_00,local_10,B,profile);
  B->_vptr_Nucleus = pp_Var5;
  std::unique_ptr<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>::operator*
            ((unique_ptr<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_> *)
             in_stack_fffffffffffffe60);
  std::unique_ptr<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>::operator*
            ((unique_ptr<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_> *)
             in_stack_fffffffffffffe60);
  dVar6 = anon_unknown_6::determine_asym(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  *(double *)(in_RDI + 0xd0) = dVar6;
  Event::Event(in_stack_00000080,in_stack_00000078);
  Output::Output(in_stack_00000060,in_stack_00000058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"random-seed",&local_99);
  this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
             *)boost::program_options::variables_map::operator[]
                         (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  __sd = boost::program_options::variable_value::as<long>((variable_value *)0x16cf63);
  lVar7 = *__sd;
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if (0 < lVar7) {
    local_78 = lVar7;
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::seed(this_00,(result_type)__sd);
  }
  return;
}

Assistant:

Collider::Collider(const VarMap& var_map)
    : nucleusA_(create_nucleus(var_map, 0)),
      nucleusB_(create_nucleus(var_map, 1)),
      nucleon_profile_(var_map),
      nevents_(var_map["number-events"].as<int>()),
      bmin_(var_map["b-min"].as<double>()),
      bmax_(determine_bmax(var_map, *nucleusA_, *nucleusB_, nucleon_profile_)),
      asymmetry_(determine_asym(*nucleusA_, *nucleusB_)),
      event_(var_map),
      output_(var_map) {
  // Constructor body begins here.
  // Set random seed if requested.
  auto seed = var_map["random-seed"].as<int64_t>();
  if (seed > 0)
    random::engine.seed(static_cast<random::Engine::result_type>(seed));
}